

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::CheckData
          (CompressedSubImageTest *this,GLenum target,GLenum internalformat)

{
  ostringstream *this_00;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  GLubyte *pGVar4;
  char *pcVar5;
  ulong uVar6;
  string local_210;
  string local_1f0;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pGVar4 = (GLubyte *)operator_new__((ulong)this->m_reference_size);
  this->m_result = pGVar4;
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x7c8))(target,0,pGVar4);
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"glGetCompressedTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x12b2);
  uVar1 = this->m_reference_size;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    if (uVar1 == uVar6) goto LAB_00b2e44e;
    uVar2 = uVar6 + 1;
  } while (this->m_reference[uVar6] == this->m_result[uVar6]);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  pcVar5 = "glCompressedTextureSubImage*D created texture with data ";
  std::operator<<((ostream *)this_00,"glCompressedTextureSubImage*D created texture with data ");
  DataToString_abi_cxx11_
            (&local_1f0,(CompressedSubImageTest *)pcVar5,this->m_reference_size,this->m_reference);
  std::operator<<((ostream *)this_00,(string *)&local_1f0);
  pcVar5 = " however texture contains data ";
  std::operator<<((ostream *)this_00," however texture contains data ");
  DataToString_abi_cxx11_
            (&local_210,(CompressedSubImageTest *)pcVar5,this->m_reference_size,this->m_result);
  std::operator<<((ostream *)this_00,(string *)&local_210);
  std::operator<<((ostream *)this_00,". Texture target was ");
  local_1c0.m_getName = glu::getTextureTargetName;
  local_1c0.m_value = target;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::operator<<((ostream *)this_00," and internal format was ");
  local_1d0.m_getName = glu::getTextureFormatName;
  local_1d0.m_value = internalformat;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
  std::operator<<((ostream *)this_00,". Test fails.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream(this_00);
LAB_00b2e44e:
  return uVar1 <= uVar6;
}

Assistant:

bool CompressedSubImageTest::CheckData(glw::GLenum target, glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check texture content with reference. */
	m_result = new glw::GLubyte[m_reference_size];

	if (DE_NULL == m_result)
	{
		throw 0;
	}

	gl.getCompressedTexImage(target, 0, m_result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetCompressedTexImage has failed");

	for (glw::GLuint i = 0; i < m_reference_size; ++i)
	{
		if (m_reference[i] != m_result[i])
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "glCompressedTextureSubImage*D created texture with data "
				<< DataToString(m_reference_size, m_reference) << " however texture contains data "
				<< DataToString(m_reference_size, m_result) << ". Texture target was "
				<< glu::getTextureTargetStr(target) << " and internal format was "
				<< glu::getTextureFormatStr(internalformat) << ". Test fails." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}